

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

int __thiscall
leveldb::Version::PickLevelForMemTableOutput
          (Version *this,Slice *smallest_user_key,Slice *largest_user_key)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> overlaps;
  InternalKey limit;
  InternalKey start;
  ParsedInternalKey local_98;
  string local_70;
  string local_50;
  
  iVar4 = 0;
  bVar1 = SomeFileOverlapsRange
                    (&this->vset_->icmp_,false,this->files_,smallest_user_key,largest_user_key);
  if (!bVar1) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_98.user_key.data_ = smallest_user_key->data_;
    local_98.user_key.size_ = smallest_user_key->size_;
    local_98.sequence = 0xffffffffffffff;
    local_98.type = kTypeValue;
    AppendInternalKey(&local_50,&local_98);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_98.user_key.data_ = largest_user_key->data_;
    local_98.user_key.size_ = largest_user_key->size_;
    local_98.sequence = 0;
    local_98.type = kTypeDeletion;
    AppendInternalKey(&local_70,&local_98);
    local_98.sequence = 0;
    local_98.user_key.data_ = (char *)0x0;
    local_98.user_key.size_ = 0;
    lVar2 = 0;
    do {
      lVar5 = lVar2;
      if (lVar5 == 2) {
        lVar5 = 2;
        break;
      }
      bVar1 = SomeFileOverlapsRange
                        (&this->vset_->icmp_,true,this->files_ + lVar5 + 1,smallest_user_key,
                         largest_user_key);
      if (bVar1) break;
      GetOverlappingInputs
                (this,(uint)lVar5 | 2,(InternalKey *)&local_50,(InternalKey *)&local_70,
                 (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                 &local_98);
      if (local_98.user_key.size_ - (long)local_98.user_key.data_ == 0) {
        lVar3 = 0;
      }
      else {
        lVar2 = (long)(local_98.user_key.size_ - (long)local_98.user_key.data_) >> 3;
        lVar6 = 0;
        lVar3 = 0;
        do {
          lVar3 = lVar3 + *(long *)(*(long *)(local_98.user_key.data_ + lVar6 * 8) + 0x10);
          lVar6 = lVar6 + 1;
        } while (lVar2 + (ulong)(lVar2 == 0) != lVar6);
      }
      lVar2 = lVar5 + 1;
    } while (lVar3 <= (long)(this->vset_->options_->max_file_size * 10));
    iVar4 = (int)lVar5;
    if (local_98.user_key.data_ != (char *)0x0) {
      operator_delete(local_98.user_key.data_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return iVar4;
}

Assistant:

int Version::PickLevelForMemTableOutput(const Slice& smallest_user_key,
                                        const Slice& largest_user_key) {
  int level = 0;
  if (!OverlapInLevel(0, &smallest_user_key, &largest_user_key)) {
    // Push to next level if there is no overlap in next level,
    // and the #bytes overlapping in the level after that are limited.
    InternalKey start(smallest_user_key, kMaxSequenceNumber, kValueTypeForSeek);
    InternalKey limit(largest_user_key, 0, static_cast<ValueType>(0));
    std::vector<FileMetaData*> overlaps;
    while (level < config::kMaxMemCompactLevel) {
      if (OverlapInLevel(level + 1, &smallest_user_key, &largest_user_key)) {
        break;
      }
      if (level + 2 < config::kNumLevels) {
        // Check that file does not overlap too many grandparent bytes.
        GetOverlappingInputs(level + 2, &start, &limit, &overlaps);
        const int64_t sum = TotalFileSize(overlaps);
        if (sum > MaxGrandParentOverlapBytes(vset_->options_)) {
          break;
        }
      }
      level++;
    }
  }
  return level;
}